

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>>::operator()
          (AssertionResult *__return_storage_ptr__,
          SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>> *this,
          vector<int,_std::allocator<int>_> *actual)

{
  bool bVar1;
  AssertionResult *rhs;
  string local_68;
  AssertionResult local_48;
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *actual_local;
  SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>_> *this_local;
  
  local_20 = actual;
  actual_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (SizeIsMatcher<iutest::detail::LtMatcher<unsigned_int>_> *)__return_storage_ptr__;
  bVar1 = Check<std::vector<int,std::allocator<int>>>(this,actual);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    AssertionFailure();
    WhichIs_abi_cxx11_(&local_68,this);
    rhs = AssertionResult::operator<<(&local_48,&local_68);
    AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
    std::__cxx11::string::~string((string *)&local_68);
    AssertionResult::~AssertionResult(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }